

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack23_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x800000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] - base >> 9;
  *puVar1 = (in[2] - base) * 0x4000 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2] - base >> 0x12;
  *puVar1 = (in[3] - base) * 0x20 | *puVar1;
  *puVar1 = (in[4] - base) * 0x10000000 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[4] - base >> 4;
  *puVar1 = (in[5] - base) * 0x80000 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[5] - base >> 0xd;
  *puVar1 = (in[6] - base) * 0x400 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[6] - base >> 0x16;
  *puVar1 = (in[7] - base) * 2 | *puVar1;
  *puVar1 = (in[8] - base) * 0x1000000 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[8] - base >> 8;
  *puVar1 = (in[9] - base) * 0x8000 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[9] - base >> 0x11;
  *puVar1 = (in[10] - base) * 0x40 | *puVar1;
  *puVar1 = (in[0xb] - base) * 0x20000000 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[0xb] - base >> 3;
  *puVar1 = (in[0xc] - base) * 0x100000 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[0xc] - base >> 0xc;
  *puVar1 = (in[0xd] - base) * 0x800 | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[0xd] - base >> 0x15;
  *puVar1 = (in[0xe] - base) * 4 | *puVar1;
  *puVar1 = (in[0xf] - base) * 0x2000000 | *puVar1;
  out[0xb] = in[0xf] - base >> 7;
  return out + 0xc;
}

Assistant:

uint32_t * pack23_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  23 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  14 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  5 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  5 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  19 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  10 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  10 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  1 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  1 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  15 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  15 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  6 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  29 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  20 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  11 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  11 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  25 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 23  -  16 );
    ++in;

    return out + 1;
}